

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode
JsVarSerializerWriteRawBytes(JsVarSerializerHandle serializerHandle,void *source,size_t length)

{
  JsErrorCode JVar1;
  JsrtContext *currentContext;
  ChakraCoreStreamWriter *streamWriter;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar1 = JsErrorNullArgument;
  if (source != (void *)0x0 && serializerHandle != (JsVarSerializerHandle)0x0) {
    currentContext = JsrtContext::GetCurrent();
    JVar1 = CheckContext(currentContext,false,false);
    if (JVar1 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      ChakraCoreStreamWriter::WriteRawBytes
                ((ChakraCoreStreamWriter *)serializerHandle,source,length);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
      JVar1 = JsNoError;
    }
  }
  return JVar1;
}

Assistant:

CHAKRA_API
JsVarSerializerWriteRawBytes(
    _In_ JsVarSerializerHandle serializerHandle,
    _In_ const void* source,
    _In_ size_t length)
{
    PARAM_NOT_NULL(serializerHandle);
    PARAM_NOT_NULL(source);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraCoreStreamWriter* streamWriter = reinterpret_cast<ChakraCoreStreamWriter*>(serializerHandle);
        streamWriter->WriteRawBytes(source, length);
        return JsNoError;
    });
}